

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_merge_capabilities
              (amqp_table_t *base,amqp_table_t *add,amqp_table_t *result,amqp_pool_t *pool)

{
  amqp_table_entry_t_ *paVar1;
  amqp_bytes_t key;
  amqp_bytes_t key_00;
  void *pvVar2;
  amqp_table_t *in_RCX;
  amqp_table_t *in_RDX;
  amqp_table_t *in_RSI;
  int *in_RDI;
  amqp_table_entry_t *be;
  amqp_table_entry_t *e;
  amqp_table_t temp_result;
  amqp_pool_t temp_pool;
  int res;
  int i;
  amqp_pool_t *in_stack_ffffffffffffff68;
  amqp_table_entry_t *in_stack_ffffffffffffff70;
  amqp_pool_t *in_stack_ffffffffffffff78;
  int local_80;
  amqp_pool_t local_70;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int local_4;
  
  if (in_RSI == (amqp_table_t *)0x0) {
    local_4 = amqp_table_clone((amqp_table_t *)in_stack_ffffffffffffff78,
                               (amqp_table_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    init_amqp_pool(&local_70,0x1000);
    local_80 = 0;
    pvVar2 = amqp_pool_alloc(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    if (pvVar2 == (void *)0x0) {
      local_4 = -1;
    }
    else {
      for (iVar3 = 0; iVar3 < *in_RDI; iVar3 = iVar3 + 1) {
        memcpy((void *)((long)pvVar2 + (long)local_80 * 0x28),
               (void *)(*(long *)(in_RDI + 2) + (long)iVar3 * 0x28),0x28);
        local_80 = local_80 + 1;
      }
      for (iVar3 = 0; iVar3 < in_RSI->num_entries; iVar3 = iVar3 + 1) {
        key.bytes = in_stack_ffffffffffffff78;
        key.len = (size_t)in_stack_ffffffffffffff70;
        in_stack_ffffffffffffff78 =
             (amqp_pool_t *)
             amqp_table_get_entry_by_key((amqp_table_t *)in_stack_ffffffffffffff68,key);
        if (in_stack_ffffffffffffff78 == (amqp_pool_t *)0x0) {
          memcpy((void *)((long)pvVar2 + (long)local_80 * 0x28),in_RSI->entries + iVar3,0x28);
          local_80 = local_80 + 1;
        }
        else if ((in_RSI->entries[iVar3].value.kind == 'F') &&
                (*(char *)&(in_stack_ffffffffffffff78->pages).blocklist == 'F')) {
          key_00.bytes = in_stack_ffffffffffffff78;
          key_00.len = (size_t)in_stack_ffffffffffffff70;
          in_stack_ffffffffffffff70 =
               amqp_table_get_entry_by_key((amqp_table_t *)in_stack_ffffffffffffff68,key_00);
          local_4 = amqp_merge_capabilities
                              (in_RSI,in_RDX,in_RCX,
                               (amqp_pool_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
          if (local_4 != 0) goto LAB_00113756;
          in_stack_ffffffffffffffd0 = 0;
        }
        else {
          paVar1 = in_RSI->entries;
          (in_stack_ffffffffffffff78->pages).blocklist = *(void ***)&paVar1[iVar3].value;
          ((anon_union_16_15_ecedea02_for_value *)&in_stack_ffffffffffffff78->large_blocks)->i64 =
               paVar1[iVar3].value.value.i64;
          (((anon_union_16_15_ecedea02_for_value *)&in_stack_ffffffffffffff78->large_blocks)->bytes)
          .bytes = paVar1[iVar3].value.value.bytes.bytes;
        }
      }
      local_4 = amqp_table_clone((amqp_table_t *)in_stack_ffffffffffffff78,
                                 (amqp_table_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                                );
    }
LAB_00113756:
    empty_amqp_pool((amqp_pool_t *)0x113760);
  }
  return local_4;
}

Assistant:

int amqp_merge_capabilities(const amqp_table_t *base, const amqp_table_t *add,
                            amqp_table_t *result, amqp_pool_t *pool) {
  int i;
  int res;
  amqp_pool_t temp_pool;
  amqp_table_t temp_result;
  assert(base != NULL);
  assert(result != NULL);
  assert(pool != NULL);

  if (NULL == add) {
    return amqp_table_clone(base, result, pool);
  }

  init_amqp_pool(&temp_pool, 4096);
  temp_result.num_entries = 0;
  temp_result.entries =
      amqp_pool_alloc(&temp_pool, sizeof(amqp_table_entry_t) *
                                      (base->num_entries + add->num_entries));
  if (NULL == temp_result.entries) {
    res = AMQP_STATUS_NO_MEMORY;
    goto error_out;
  }
  for (i = 0; i < base->num_entries; ++i) {
    temp_result.entries[temp_result.num_entries] = base->entries[i];
    temp_result.num_entries++;
  }
  for (i = 0; i < add->num_entries; ++i) {
    amqp_table_entry_t *e =
        amqp_table_get_entry_by_key(&temp_result, add->entries[i].key);
    if (NULL != e) {
      if (AMQP_FIELD_KIND_TABLE == add->entries[i].value.kind &&
          AMQP_FIELD_KIND_TABLE == e->value.kind) {
        amqp_table_entry_t *be =
            amqp_table_get_entry_by_key(base, add->entries[i].key);

        res = amqp_merge_capabilities(&be->value.value.table,
                                      &add->entries[i].value.value.table,
                                      &e->value.value.table, &temp_pool);
        if (AMQP_STATUS_OK != res) {
          goto error_out;
        }
      } else {
        e->value = add->entries[i].value;
      }
    } else {
      temp_result.entries[temp_result.num_entries] = add->entries[i];
      temp_result.num_entries++;
    }
  }
  res = amqp_table_clone(&temp_result, result, pool);
error_out:
  empty_amqp_pool(&temp_pool);
  return res;
}